

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cURLpp.cpp
# Opt level: O0

string * curlpp::unescape(string *url)

{
  undefined4 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  string *in_RDI;
  RuntimeError *unaff_retaddr;
  char *p;
  string *buffer;
  string *reason;
  
  reason = in_RDI;
  std::__cxx11::string::string(in_RDI);
  uVar2 = std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::size();
  pcVar3 = (char *)curl_unescape(uVar2,uVar1);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::operator=(in_RDI,pcVar3);
    curl_free(pcVar3);
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  RuntimeError::RuntimeError(unaff_retaddr,(char *)reason);
  __cxa_throw(uVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

std::string
curlpp::unescape(const std::string & url)
{
   std::string buffer;
   char* p = curl_unescape(url.c_str(), (int)url.size());
   if (!p)
   {
      throw RuntimeError("unable to escape the string"); //we got an error
   }
   else
   {
      buffer = p;
      curl_free(p);
   }
   return buffer;
}